

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

int Bac_ObjGetRange(Bac_Ntk_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)iObj;
  uVar2 = Bac_ObjName(p,iObj);
  if ((iObj < 0) || ((p->vType).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  uVar3 = (uint)(byte)(p->vType).pArray[uVar5];
  if ((9 < uVar3) || ((0x30cU >> (uVar3 & 0x1f) & 1) == 0)) {
    __assert_fail("Bac_ObjIsCi(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0xc6,"int Bac_ObjGetRange(Bac_Ntk_t *, int)");
  }
  if (uVar2 != 0) {
    if ((int)uVar2 < 0) {
LAB_003a38e2:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                    ,0x13e,"int Abc_Lit2Att2(int)");
    }
    if (1 < (uVar2 & 3) - 1) {
      __assert_fail("Bac_NameType(NameId) == BAC_NAME_WORD || Bac_NameType(NameId) == BAC_NAME_INFO"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                    ,0xc9,"int Bac_ObjGetRange(Bac_Ntk_t *, int)");
    }
    iVar1 = 1;
    while( true ) {
      iVar4 = iVar1;
      uVar5 = uVar5 + 1;
      if ((p->vType).nSize <= (int)uVar5) {
        return iVar4;
      }
      uVar2 = (uint)(byte)(p->vType).pArray[uVar5];
      if (9 < uVar2) {
        return iVar4;
      }
      if ((0x30cU >> (uVar2 & 0x1f) & 1) == 0) {
        return iVar4;
      }
      uVar2 = Bac_ObjName(p,(int)uVar5);
      if (uVar2 == 0) break;
      if ((int)uVar2 < 0) goto LAB_003a38e2;
      iVar1 = iVar4 + 1;
      if ((~uVar2 & 3) != 0) {
        return iVar4;
      }
    }
  }
  __assert_fail("n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                ,0x107,"Bac_NameType_t Bac_NameType(int)");
}

Assistant:

static inline int Bac_ObjGetRange( Bac_Ntk_t * p, int iObj )
{
    int i, NameId = Bac_ObjName(p, iObj);
    assert( Bac_ObjIsCi(p, iObj) );
//    if ( Bac_NameType(NameId) == BAC_NAME_INDEX )
//        NameId = Bac_ObjName(p, iObj - Abc_Lit2Var2(NameId));
    assert( Bac_NameType(NameId) == BAC_NAME_WORD || Bac_NameType(NameId) == BAC_NAME_INFO );
    for ( i = iObj + 1; i < Bac_NtkObjNum(p); i++ )
        if ( !Bac_ObjIsCi(p, i) || Bac_ObjNameType(p, i) != BAC_NAME_INDEX )
            break;
    return i - iObj;
}